

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  undefined8 *puVar6;
  char *pcVar7;
  FILE *__stream;
  size_t sVar8;
  size_t sVar9;
  FILE *__stream_00;
  byte bVar10;
  char *pcVar11;
  char *pcVar12;
  addrinfo *ai;
  addrinfo hints;
  char *local_8b0;
  addrinfo *local_8a8;
  FILE *local_8a0;
  addrinfo local_898;
  int local_868 [526];
  
  fileName = *argv;
  local_8a0 = _stdout;
  local_8b0 = (char *)malloc(0x400);
  pcVar11 = "80";
  bVar10 = 0;
  bVar2 = false;
  do {
LAB_0010181c:
    iVar4 = __posix_getopt(argc,argv,"p:o:d:");
    if (iVar4 == 0x70) {
      if (!bVar2) break;
      main_cold_3();
      goto LAB_00101b72;
    }
    if (iVar4 == -1) {
      pcVar12 = argv[_optind];
      if (pcVar12 == (char *)0x0) {
LAB_00101b7c:
        main_cold_15();
LAB_00101b81:
        main_cold_5();
LAB_00101b86:
        main_cold_6();
LAB_00101b8b:
        main_cold_14();
LAB_00101b90:
        main_cold_13();
LAB_00101b95:
        main_cold_12();
LAB_00101b9a:
        main_cold_11();
LAB_00101b9f:
        main_cold_10();
LAB_00101ba4:
        main_cold_7();
      }
      else {
        puVar6 = (undefined8 *)malloc(0x10);
        iVar4 = strncmp(pcVar12,"http://",7);
        if (iVar4 != 0) goto LAB_00101b81;
        pcVar12 = pcVar12 + 7;
        pcVar7 = strpbrk(pcVar12,";/?:@=&");
        if (pcVar7 == (char *)0x0) {
          pcVar12 = strdup(pcVar12);
          *puVar6 = pcVar12;
LAB_0010192d:
          pcVar7 = "index.html";
        }
        else {
          pcVar12 = strndup(pcVar12,(long)pcVar7 - (long)pcVar12);
          *puVar6 = pcVar12;
          if (pcVar7[1] == '\0') goto LAB_0010192d;
          pcVar7 = pcVar7 + 1;
        }
        pcVar7 = strdup(pcVar7);
        puVar6[1] = pcVar7;
        local_898.ai_flags = 0;
        local_898.ai_protocol = 0;
        local_898.ai_addrlen = 0;
        local_898._20_4_ = 0;
        local_898.ai_addr = (sockaddr *)0x0;
        local_898.ai_canonname = (char *)0x0;
        local_898.ai_next = (addrinfo *)0x0;
        local_898.ai_family = 2;
        local_898.ai_socktype = 1;
        iVar4 = getaddrinfo(pcVar12,pcVar11,&local_898,&local_8a8);
        if (iVar4 != 0) goto LAB_00101b86;
        iVar4 = socket(local_8a8->ai_family,local_8a8->ai_socktype,local_8a8->ai_protocol);
        if (iVar4 < 0) goto LAB_00101b8b;
        iVar5 = connect(iVar4,local_8a8->ai_addr,local_8a8->ai_addrlen);
        if (iVar5 < 0) goto LAB_00101b90;
        __stream = fdopen(iVar4,"r+");
        if (__stream == (FILE *)0x0) goto LAB_00101b95;
        uVar1 = *puVar6;
        pcVar11 = (char *)puVar6[1];
        memset(local_868,0,0x82c);
        sprintf((char *)local_868,"GET /%s HTTP/1.1\r\nHost: %s\r\nConnection: close\r\n\r\n",
                pcVar11,uVar1);
        iVar4 = fputs((char *)local_868,__stream);
        if (iVar4 == -1) goto LAB_00101b9a;
        iVar4 = fflush(__stream);
        __stream_00 = local_8a0;
        if (iVar4 == -1) goto LAB_00101b9f;
        pcVar12 = (char *)malloc(0x400);
        fgets(pcVar12,0x400,__stream);
        iVar4 = __isoc99_sscanf(pcVar12,"HTTP/1.1 %d",local_868);
        if (iVar4 != 1) goto LAB_00101ba4;
        if (local_868[0] == 200) {
          free(pcVar12);
          if (bVar10 != 0) {
            sVar8 = strlen(local_8b0);
            if ((bVar10 & 4) == 0) {
              pcVar12 = (char *)malloc(sVar8 + 1);
              strcpy(pcVar12,local_8b0);
            }
            else {
              sVar9 = strlen(pcVar11);
              pcVar12 = (char *)malloc(sVar8 + sVar9 + 2);
              strcpy(pcVar12,local_8b0);
              sVar8 = strlen(pcVar12);
              (pcVar12 + sVar8)[0] = '/';
              (pcVar12 + sVar8)[1] = '\0';
              strcat(pcVar12,pcVar11);
            }
            __stream_00 = fopen(pcVar12,"w");
            free(pcVar12);
            free(local_8b0);
            if (__stream_00 == (FILE *)0x0) goto LAB_00101bbe;
          }
          goToEndOfHeader((FILE *)__stream);
          writeFileToFile((FILE *)__stream,(FILE *)__stream_00);
          fflush(__stream_00);
          fclose(__stream_00);
          free((void *)*puVar6);
          free((void *)puVar6[1]);
          fclose(__stream);
          return 0;
        }
      }
      main_cold_8();
LAB_00101bb4:
      main_cold_2();
LAB_00101bb9:
      main_cold_1();
LAB_00101bbe:
      main_cold_9();
      halt_baddata();
    }
    if (iVar4 == 100) {
      bVar3 = 4;
      if (bVar10 != 0) goto LAB_00101bb9;
    }
    else {
      if (iVar4 != 0x6f) {
LAB_00101b77:
        main_cold_16();
        goto LAB_00101b7c;
      }
      bVar3 = 2;
      if (bVar10 != 0) goto LAB_00101bb4;
    }
    bVar10 = bVar10 | bVar3;
    local_8b0 = strdup(_optarg);
  } while( true );
  pcVar11 = strdup(_optarg);
  iVar4 = isValidPort(pcVar11);
  bVar2 = true;
  if (iVar4 == 0) {
LAB_00101b72:
    main_cold_4();
    goto LAB_00101b77;
  }
  goto LAB_0010181c;
}

Assistant:

int main(int argc, char *argv[]) {
	fileName = argv[0];
	FLAG_S flags = {0,0,0};
	FILE * out = stdout;
	char* p_port = "80";
	char *d_dir= malloc(sizeof(char)*CHARLENGTH);

	int c;
	while ((c= getopt(argc, argv, "p:o:d:")) != -1) {
		switch (c) {
		case 'p':
			if (flags.p_flag) { USAGE(); }
				 flags.p_flag++; 
				 p_port = strdup(optarg);
				 if (isValidPort(p_port) == 0) {
					 ERROR_EXIT("INVALID PORT");
				 }
				 break;
		case 'o':
			if (flags.o_flag || flags.d_flag) { USAGE(); }
				flags.o_flag++; 
				d_dir = strdup(optarg);
				break;
		case 'd':
			if(flags.o_flag || flags.d_flag) { USAGE(); }
				flags.d_flag++; 
				d_dir = strdup(optarg);
				break;
		default:
			USAGE();
		}
	}
	
	
	char * fullUrl;
	if ((fullUrl=argv[optind]) == NULL) {
		USAGE();
	}
	URL_S *url = URL(fullUrl);


	struct addrinfo hints, *ai;
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_INET; // create Internet Protocol (IP) socket
	hints.ai_socktype = SOCK_STREAM; // use TCP as transport protocol

	if (getaddrinfo(url->url, p_port, &hints, &ai) != 0) {ERROR_EXIT("getaddrinfo");}

	int sockfd;
	if ((sockfd = socket(ai->ai_family, ai->ai_socktype, ai->ai_protocol)) < 0) { ERROR_EXIT("socket"); }

	if ((connect(sockfd, ai->ai_addr, ai->ai_addrlen)) < 0)
		ERROR_EXIT("connection");

	FILE *sockfile = fdopen(sockfd, "r+");
	if (sockfile == NULL)
		ERROR_EXIT("fdopen");


	printHeader(sockfile,url);
	checkResponseHeader(sockfile);


	
	if (flags.o_flag || flags.d_flag) {
		char * pathOutFile;
		if (flags.d_flag) {
			pathOutFile = malloc((strlen(d_dir) + 2 + strlen(url->file)) * sizeof(char));
			strcpy(pathOutFile,d_dir);
			strcat(pathOutFile, "/");
			strcat(pathOutFile, url->file);
		} else{
			pathOutFile = malloc((strlen(d_dir) + 1) * sizeof(char));
			strcpy(pathOutFile,d_dir);
		}
		out = fopen(pathOutFile, "w");
		free(pathOutFile);
		free(d_dir);
		if (out == NULL) {ERROR_EXIT("Could not open File"); }
	}
	
	
	goToEndOfHeader(sockfile);
	writeFileToFile(sockfile,out);
	fflush(out);
	fclose(out);
	free_URL(url);
	fclose(sockfile);
	return 0;
}